

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

UCVarValue FBaseCVar::FromString(char *value,ECVarType type)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  int local_20;
  int i;
  ECVarType type_local;
  char *value_local;
  UCVarValue ret;
  
  switch(type) {
  case CVAR_Bool:
    iVar1 = strcasecmp(value,"true");
    if (iVar1 == 0) {
      value_local = (char *)CONCAT71(value_local._1_7_,1);
    }
    else {
      iVar1 = strcasecmp(value,"false");
      if (iVar1 == 0) {
        value_local = (char *)((ulong)value_local._1_7_ << 8);
      }
      else {
        lVar2 = strtol(value,(char **)0x0,0);
        value_local = (char *)CONCAT71(value_local._1_7_,lVar2 != 0);
      }
    }
    break;
  case CVAR_Int:
    iVar1 = strcasecmp(value,"true");
    if (iVar1 == 0) {
      value_local = (char *)CONCAT44(value_local._4_4_,1);
    }
    else {
      iVar1 = strcasecmp(value,"false");
      if (iVar1 == 0) {
        value_local = (char *)((ulong)value_local._4_4_ << 0x20);
      }
      else {
        lVar2 = strtol(value,(char **)0x0,0);
        value_local = (char *)CONCAT44(value_local._4_4_,(int)lVar2);
      }
    }
    break;
  case CVAR_Float:
    dVar4 = strtod(value,(char **)0x0);
    value_local = (char *)CONCAT44(value_local._4_4_,(float)dVar4);
    break;
  case CVAR_String:
    value_local = value;
    break;
  default:
    break;
  case CVAR_GUID:
    value_local = (char *)0x0;
    if (value != (char *)0x0) {
      for (local_20 = 0; value[local_20] != '\0' && local_20 < 0x26; local_20 = local_20 + 1) {
      }
      if ((local_20 == 0x26) && (value[0x26] == '\0')) {
        uVar3 = strtoul(value + 1,(char **)0x0,0x10);
        cGUID.Data1 = (DWORD)uVar3;
        uVar3 = strtoul(value + 10,(char **)0x0,0x10);
        cGUID.Data2 = (WORD)uVar3;
        uVar3 = strtoul(value + 0xf,(char **)0x0,0x10);
        cGUID.Data3 = (WORD)uVar3;
        cGUID.Data4[0] = HexToByte(value + 0x14);
        cGUID.Data4[1] = HexToByte(value + 0x16);
        cGUID.Data4[2] = HexToByte(value + 0x19);
        cGUID.Data4[3] = HexToByte(value + 0x1b);
        cGUID.Data4[4] = HexToByte(value + 0x1d);
        cGUID.Data4[5] = HexToByte(value + 0x1f);
        cGUID.Data4[6] = HexToByte(value + 0x21);
        cGUID.Data4[7] = HexToByte(value + 0x23);
        value_local = (char *)&cGUID;
      }
    }
  }
  return (UCVarValue)value_local;
}

Assistant:

UCVarValue FBaseCVar::FromString (const char *value, ECVarType type)
{
	UCVarValue ret;
	int i;

	switch (type)
	{
	case CVAR_Bool:
		if (stricmp (value, "true") == 0)
			ret.Bool = true;
		else if (stricmp (value, "false") == 0)
			ret.Bool = false;
		else
			ret.Bool = strtol (value, NULL, 0) != 0;
		break;

	case CVAR_Int:
		if (stricmp (value, "true") == 0)
			ret.Int = 1;
		else if (stricmp (value, "false") == 0)
			ret.Int = 0;
		else
			ret.Int = strtol (value, NULL, 0);
		break;

	case CVAR_Float:
		ret.Float = (float)strtod (value, NULL);
		break;

	case CVAR_String:
		ret.String = const_cast<char *>(value);
		break;

	case CVAR_GUID:
		// {xxxxxxxx-xxxx-xxxx-xxxx-xxxxxxxxxxxx}
		// 01234567890123456789012345678901234567
		// 0         1         2         3

		ret.pGUID = NULL;
		if (value == NULL)
		{
			break;
		}
		for (i = 0; value[i] != 0 && i < 38; i++)
		{
			switch (i)
			{
			case 0:
				if (value[i] != '{')
					break;
			case 9:
			case 14:
			case 19:
			case 24:
				if (value[i] != '-')
					break;
			case 37:
				if (value[i] != '}')
					break;
			default:
				if (value[i] < '0' || 
					(value[i] > '9' && value[i] < 'A') || 
					(value[i] > 'F' && value[i] < 'a') || 
					value[i] > 'f')
					break;
			}
		}
		if (i == 38 && value[i] == 0)
		{
			cGUID.Data1 = strtoul (value + 1, NULL, 16);
			cGUID.Data2 = (WORD)strtoul (value + 10, NULL, 16);
			cGUID.Data3 = (WORD)strtoul (value + 15, NULL, 16);
			cGUID.Data4[0] = HexToByte (value + 20);
			cGUID.Data4[1] = HexToByte (value + 22);
			cGUID.Data4[2] = HexToByte (value + 25);
			cGUID.Data4[3] = HexToByte (value + 27);
			cGUID.Data4[4] = HexToByte (value + 29);
			cGUID.Data4[5] = HexToByte (value + 31);
			cGUID.Data4[6] = HexToByte (value + 33);
			cGUID.Data4[7] = HexToByte (value + 35);
			ret.pGUID = &cGUID;
		}
		break;

	default:
		break;
	}

	return ret;
}